

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  char cVar7;
  int iVar8;
  size_t sVar9;
  istream *piVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  ostream *poVar14;
  int iVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  ulong uVar16;
  str *psVar17;
  int iVar18;
  uint uVar19;
  char *__s;
  bool bVar20;
  bool bVar21;
  string ln;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pr;
  ifstream fs;
  stringstream out;
  stringstream err;
  undefined1 auStack_658 [8];
  int local_650;
  uint local_64c;
  ulong local_648;
  char *local_640;
  char *local_638;
  ulong local_630;
  char local_628 [16];
  value_type local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  str *local_5b8;
  uint local_5ac;
  undefined1 *local_5a8;
  size_t local_5a0;
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  str *local_568;
  ios_base *local_560;
  ios_base *local_558;
  str *local_550;
  long local_548 [3];
  int aiStack_52c [123];
  ostream *local_340 [2];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  if (argc < 2) {
    __s = "tests.txt";
  }
  else {
    __s = argv[1];
  }
  std::ifstream::ifstream(local_548);
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (str *)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (str *)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (str *)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (str *)0x0;
  local_638 = local_628;
  local_630 = 0;
  local_628[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  std::ifstream::open((char *)local_548,(_Ios_Openmode)__s);
  if (*(int *)((long)aiStack_52c + *(long *)(local_548[0] + -0x18) + 4) == 0) {
    local_560 = aiStack_138;
    local_558 = aiStack_2c0;
    local_648 = 0;
    local_650 = 0;
    iVar18 = 0;
    local_640 = __s;
    do {
      lVar11 = *(long *)(local_548[0] + -0x18);
      *(undefined4 *)((long)aiStack_52c + lVar11) = 1;
      std::ios::clear((int)auStack_658 + (int)lVar11 + 0x110);
      cVar7 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + (char)local_548);
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_548,(string *)&local_638,cVar7);
      local_5ac = *(uint *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18) + 0x20);
      if ((local_5ac & 5) != 0) break;
      lVar11 = *(long *)(local_548[0] + -0x18);
      *(undefined4 *)((long)aiStack_52c + lVar11) = 5;
      std::ios::clear((int)auStack_658 + (int)lVar11 + 0x110);
      iVar15 = iVar18 + 1;
      bVar20 = true;
      if (local_630 < 2) {
LAB_001089f2:
        uVar19 = (uint)local_648;
      }
      else {
        iVar8 = std::__cxx11::string::find(-8,(ulong)(uint)(int)*local_638);
        local_64c = iVar8 + 1;
        if ((local_64c == 0) || ((cVar7 = local_638[1], cVar7 != '[' && (cVar7 != '='))))
        goto LAB_001089f2;
        if ((2 < (int)local_64c) &&
           ((local_5d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             local_5d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ||
            (local_5f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             local_5f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Bad test file format at line ",0x1d);
          plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar15);
          std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
LAB_001089d5:
          std::ostream::put((char)plVar12);
          std::ostream::flush();
          local_650 = 2;
          bVar20 = false;
          goto LAB_001089f2;
        }
        if (cVar7 == '[') {
          lVar11 = std::__cxx11::string::find_first_not_of((char)&local_638,0x5b);
          if (lVar11 != -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Bad test file format at line ",0x1d);
            plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar15);
            std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
            goto LAB_001089d5;
          }
          uVar16 = local_630 - 1;
          local_618._M_string_length = 0;
          *local_618._M_dataplus._M_p = '\0';
          iVar15 = iVar18 + 2;
          bVar21 = true;
          while( true ) {
            cVar7 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + (char)local_548);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_548,(string *)&local_638,cVar7);
            uVar13 = std::__cxx11::string::find_first_not_of((char)&local_638,0x5d);
            if (uVar16 <= local_630 && uVar16 <= uVar13) break;
            if (bVar21) {
              bVar21 = false;
            }
            else {
              std::__cxx11::string::append((char *)&local_618);
            }
            iVar15 = iVar15 + 1;
            std::__cxx11::string::_M_append((char *)&local_618,(ulong)local_638);
          }
          uVar19 = local_64c;
          if (local_630 == uVar16) goto LAB_00108b3f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Bad test file format at line ",0x1d);
          plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar15);
          std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
          std::ostream::put((char)plVar12);
          local_650 = 2;
          std::ostream::flush();
          bVar20 = false;
          uVar19 = (uint)local_648;
        }
        else {
          std::__cxx11::string::substr((ulong)local_340,(ulong)&local_638);
          std::__cxx11::string::operator=((string *)&local_618,(string *)local_340);
          uVar19 = local_64c;
          if (local_340[0] != local_330) {
            operator_delete(local_340[0]);
          }
LAB_00108b3f:
          pbVar6 = local_5d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = local_5d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = local_5f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar3 = local_5f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (iVar8 == 0) {
            this = &local_5d8;
            if ((1 < (int)(uint)local_648) &&
               (psVar17 = local_5d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               local_5d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_5d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
              do {
                pcVar1 = (psVar17->_M_dataplus)._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar1 != &psVar17->field_2) {
                  operator_delete(pcVar1);
                }
                psVar17 = psVar17 + 1;
              } while (psVar17 != pbVar6);
              local_5d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
              this = &local_5d8;
            }
          }
          else {
            if (uVar19 != 2) {
              iVar8 = 6;
              local_5b8 = local_5d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_568 = local_5d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              iVar18 = 0;
              if (local_5d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_5d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  bVar20 = local_5f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           local_5f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  local_550 = local_5f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  psVar17 = local_5f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  while (!bVar20) {
                    iVar18 = iVar18 + 1;
                    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
                    std::__cxx11::stringstream::stringstream(local_1b8);
                    interpreter(local_5b8,psVar17,local_330,local_1a8);
                    if (local_64c == 3) {
                      std::__cxx11::stringbuf::str();
                      sVar9 = local_5a0;
                      if (local_5a8 != local_598) {
                        operator_delete(local_5a8);
                      }
                      if (sVar9 == 0) {
                        std::__cxx11::stringbuf::str();
                        bVar21 = true;
                        if (local_5a0 == local_618._M_string_length) {
                          if (local_5a0 == 0) {
                            bVar21 = false;
                          }
                          else {
                            iVar8 = bcmp(local_5a8,local_618._M_dataplus._M_p,local_5a0);
                            bVar21 = iVar8 != 0;
                          }
                        }
                        if (local_5a8 != local_598) {
                          operator_delete(local_5a8);
                        }
                        bVar2 = true;
                        if (!bVar21) goto LAB_00108fcc;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Test failed: ",0xd);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"incorrect output",0x10);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr," on test #",10);
                        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar18);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar14," at line ",9);
                        plVar12 = (long *)std::ostream::operator<<((ostream *)poVar14,iVar15);
                        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Test failed: ",0xd);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"non-empty error output",0x16);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr," on test #",10);
                        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar18);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar14," at line ",9);
                        plVar12 = (long *)std::ostream::operator<<((ostream *)poVar14,iVar15);
                        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                      }
LAB_00108fae:
                      std::ostream::put((char)plVar12);
                      std::ostream::flush();
                      local_650 = 3;
                      bVar2 = false;
                    }
                    else {
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::string::substr((ulong)&local_5a8,(ulong)local_588);
                      bVar21 = true;
                      if (local_5a0 == local_618._M_string_length) {
                        if (local_5a0 == 0) {
                          bVar21 = false;
                        }
                        else {
                          iVar8 = bcmp(local_5a8,local_618._M_dataplus._M_p,local_5a0);
                          bVar21 = iVar8 != 0;
                        }
                      }
                      if (local_5a8 != local_598) {
                        operator_delete(local_5a8);
                      }
                      if (local_588[0] != local_578) {
                        operator_delete(local_588[0]);
                      }
                      bVar2 = true;
                      if (bVar21) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Test failed: ",0xd);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"incorrect error output",0x16);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr," on test #",10);
                        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar18);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar14," at line ",9);
                        plVar12 = (long *)std::ostream::operator<<((ostream *)poVar14,iVar15);
                        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                        goto LAB_00108fae;
                      }
                    }
LAB_00108fcc:
                    std::__cxx11::stringstream::~stringstream(local_1b8);
                    std::ios_base::~ios_base(local_560);
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
                    std::ios_base::~ios_base(local_558);
                    if (!bVar2) {
                      iVar8 = 1;
                      goto LAB_00109045;
                    }
                    psVar17 = psVar17 + 1;
                    bVar20 = psVar17 == local_550;
                  }
                  iVar8 = 0;
LAB_00109045:
                  uVar19 = local_64c;
                  if (!bVar20) goto LAB_00109095;
                  local_5b8 = local_5b8 + 1;
                } while (local_5b8 != local_568);
                iVar8 = 6;
              }
LAB_00109095:
              if (iVar8 == 6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Passed ",7);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," test(s) on line ",0x11)
                ;
                plVar12 = (long *)std::ostream::operator<<((ostream *)poVar14,iVar15);
                std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                std::ostream::put((char)plVar12);
                std::ostream::flush();
                iVar8 = 0;
              }
              bVar20 = iVar8 == 0;
              if (!bVar20) {
                uVar19 = (uint)local_648;
              }
              goto LAB_001089fa;
            }
            this = &local_5f8;
            if (((uint)local_648 != 2) &&
               (psVar17 = local_5f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               local_5f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_5f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
              do {
                pcVar1 = (psVar17->_M_dataplus)._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar1 != &psVar17->field_2) {
                  operator_delete(pcVar1);
                }
                psVar17 = psVar17 + 1;
              } while (psVar17 != pbVar4);
              local_5f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
              this = &local_5f8;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,&local_618);
        }
      }
LAB_001089fa:
      local_648 = (ulong)uVar19;
      iVar18 = iVar15;
    } while (bVar20);
    if ((local_5ac & 5) != 0) {
      local_650 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"All tests succeeded\n",0x14);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Couldn\'t open the file: ",0x18);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x115208);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    local_650 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p);
  }
  if (local_638 != local_628) {
    operator_delete(local_638);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d8);
  std::ifstream::~ifstream(local_548);
  return local_650;
}

Assistant:

int main(int argc, char* argv[])
{
    const char* fname = argc > 1 ? argv[1] : "tests.txt";

    std::ifstream fs;

    std::vector<std::string> pr, in;
    std::string ln, str;
    int line = 0;
#define READLN (++line, std::getline(fs, ln))
#define FMT_ASSERT(E) if(!(E)) { std::cerr << "Bad test file format at line " << line << std::endl; return 2; }
#define FAIL_TEST(MSG) std::cerr << "Test failed: " << MSG << " on test #" << ntests << " at line " << line <<std::endl; return 3

    try {
        fs.open(fname);
        if (!fs.good()) {
            std::cerr << "Couldn't open the file: " << fname << std::endl;
            return 1;
        }
        int last = 0;
        while (fs.exceptions(std::ifstream::badbit), READLN) {
            fs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
            int t, blk;
            if (ln.size() >= 2 && (t = 1 + TYPES.find(ln[0])) && ((blk = ln[1] == BLOCK_O) || ln[1] == LINE_O)) {
                if (t > 2) FMT_ASSERT(pr.size() && in.size());
                if (blk) {
                    FMT_ASSERT(!~ln.find_first_not_of(BLOCK_O, 2));
                    size_t nb = ln.size() - 1;
                    bool first = true;
                    str.clear();
                    while (READLN, ln.find_first_not_of(BLOCK_C) < nb || ln.size() < nb) {
                        if (first) first = false;
                        else str.append("\n");
                        str.append(ln);
                    }
                    FMT_ASSERT(ln.size() == nb);
                } else str = ln.substr(2);
                if (t == 1) {
                    if (last > 1) pr.clear();
                    pr.push_back(str);
                } else if (t == 2) {
                    if (last != 2) in.clear();
                    in.push_back(str);
                } else {
                    int ntests = 0;
                    for (std::string &p : pr) {
                        for (std::string &i : in) {
                            ++ntests;
                            std::stringstream out, err;
                            interpreter(p, i, out, err);
                            if (t == 3) {
                                if (!err.str().empty()) {
                                    FAIL_TEST("non-empty error output");
                                }
                                if (out.str() != str) {
                                    FAIL_TEST("incorrect output");
                                }
                            } else {
                                if (err.str().substr(0, str.size()) != str) {
                                    FAIL_TEST("incorrect error output");
                                }
                            }
                        }
                    }
                    std::cout << "Passed " << ntests << " test(s) on line " << line << std::endl;
                }
                last = t;
            }
        }

    } catch (const decltype(fs)::failure& x) {
        std::cerr << "Error reading " << fname << " : " << x.what() << std::endl;
        return 1;
    }

    std::cout << "All tests succeeded\n";

    return 0;
}